

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::Context::InitializeFieldGeneratorInfoForMessage
          (Context *this,Descriptor *message)

{
  ushort *puVar1;
  size_type sVar2;
  java *pjVar3;
  undefined1 in_R8B;
  long lVar4;
  long lVar5;
  string_view input;
  string_view input_00;
  OneofDescriptor *oneof;
  OneofGeneratorInfo info;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  OneofDescriptor *local_b0;
  FieldDescriptor *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  FileDescriptor *local_88;
  once_flag *local_80;
  undefined1 local_78 [16];
  anon_union_8_2_3066aaf9_for_type_descriptor_ local_68;
  FieldOptions *pFStack_60;
  FeatureSet *local_58;
  string local_50;
  
  if (0 < message->nested_type_count_) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      InitializeFieldGeneratorInfoForMessage
                (this,(Descriptor *)(&message->nested_types_->super_SymbolBase + lVar4));
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0xa0;
    } while (lVar5 < message->nested_type_count_);
  }
  local_68.message_type = (Descriptor *)0x0;
  pFStack_60 = (FieldOptions *)0x0;
  local_58 = (FeatureSet *)0x0;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::reserve((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)(local_78 + 0x10),(long)message->field_count_);
  if (0 < message->field_count_) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      local_a8 = (FieldDescriptor *)(&message->fields_->super_SymbolBase + lVar5);
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::emplace_back<google::protobuf::FieldDescriptor_const*>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)(local_78 + 0x10),&local_a8);
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x58;
    } while (lVar4 < message->field_count_);
  }
  InitializeFieldGeneratorInfoForFields
            (this,(vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)(local_78 + 0x10));
  if (0 < message->oneof_decl_count_) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      local_b0 = (OneofDescriptor *)(&message->oneof_decls_->super_SymbolBase + lVar4);
      local_a8 = (FieldDescriptor *)local_98;
      local_a0 = 0;
      local_98[0] = '\0';
      local_88 = (FileDescriptor *)local_78;
      local_80 = (once_flag *)0x0;
      local_78[0] = '\0';
      puVar1 = *(ushort **)((long)&(message->oneof_decls_->all_names_).payload_ + lVar4);
      pjVar3 = (java *)(ulong)*puVar1;
      input._M_len = ~(ulong)pjVar3 + (long)puVar1;
      input._M_str = (char *)0x0;
      UnderscoresToCamelCase_abi_cxx11_(&local_50,pjVar3,input,(bool)in_R8B);
      std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      puVar1 = (ushort *)(local_b0->all_names_).payload_;
      pjVar3 = (java *)(ulong)*puVar1;
      input_00._M_len = (long)puVar1 + ~(ulong)pjVar3;
      input_00._M_str = (char *)0x1;
      UnderscoresToCamelCase_abi_cxx11_(&local_50,pjVar3,input_00,(bool)in_R8B);
      std::__cxx11::string::operator=((string *)&local_88,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
      ::try_emplace_impl<google::protobuf::OneofDescriptor_const*const&>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::OneofDescriptor_*,_google::protobuf::compiler::java::OneofGeneratorInfo>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::OneofDescriptor_*const,_google::protobuf::compiler::java::OneofGeneratorInfo>_>_>::iterator,_bool>
                  *)&local_50,&this->oneof_generator_info_map_,&local_b0);
      sVar2 = local_50._M_string_length;
      std::__cxx11::string::_M_assign((string *)(local_50._M_string_length + 8));
      std::__cxx11::string::_M_assign((string *)(sVar2 + 0x28));
      if (local_88 != (FileDescriptor *)local_78) {
        operator_delete(local_88,CONCAT71(local_78._1_7_,local_78[0]) + 1);
      }
      if (local_a8 != (FieldDescriptor *)local_98) {
        operator_delete(local_a8,CONCAT71(local_98._1_7_,local_98[0]) + 1);
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x38;
    } while (lVar5 < message->oneof_decl_count_);
  }
  if (local_68.message_type != (Descriptor *)0x0) {
    operator_delete(local_68.message_type,(long)local_58 - (long)local_68);
  }
  return;
}

Assistant:

void Context::InitializeFieldGeneratorInfoForMessage(
    const Descriptor* message) {
  for (int i = 0; i < message->nested_type_count(); ++i) {
    InitializeFieldGeneratorInfoForMessage(message->nested_type(i));
  }
  std::vector<const FieldDescriptor*> fields;
  fields.reserve(message->field_count());
  for (int i = 0; i < message->field_count(); ++i) {
    fields.push_back(message->field(i));
  }
  InitializeFieldGeneratorInfoForFields(fields);

  for (int i = 0; i < message->oneof_decl_count(); ++i) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    OneofGeneratorInfo info;
    info.name = UnderscoresToCamelCase(oneof->name(), false);
    info.capitalized_name = UnderscoresToCamelCase(oneof->name(), true);
    oneof_generator_info_map_[oneof] = info;
  }
}